

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::showMapWithOwners(Map *this)

{
  ostream *poVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  string local_50;
  
  if (0 < this->gameMap->vertexCount) {
    lVar4 = 0;
    lVar3 = 0;
    lVar5 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,". ",2);
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_50,
                 (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->gameMap->vertexList->index + lVar4));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," --> {",6);
      psVar2 = Player::getPlayerName_abi_cxx11_
                         (*(Player **)
                           ((long)&((this->regionOwners).
                                    super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar3));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
      psVar2 = Player::getPlayerName_abi_cxx11_
                         (*(Player **)
                           ((long)&((this->regionOwners).
                                    super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second + lVar3));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      lVar4 = lVar4 + 0x48;
    } while (lVar5 < this->gameMap->vertexCount);
  }
  return;
}

Assistant:

void Map::showMapWithOwners() {
    for (int i = 0; i < gameMap->getVertexCount(); i++)
    {
        cout << (i) << ". " << gameMap->getVertex(i)->toString() << " --> {" << regionOwners[i].first->getPlayerName() << " , " << regionOwners[i].second->getPlayerName() << "}" << endl;
        // Player can be in all vertices except Manhattan (0) , since it can be in its subvertices
    }
}